

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QObject_*(*)()>::resize_internal(QList<QObject_*(*)()> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QObject_*(*)()> *this_00;
  __off_t __length;
  QArrayDataPointer<QObject_*(*)()> *in_RSI;
  QArrayDataPointer<QObject_*(*)()> *in_RDI;
  QArrayDataPointer<QObject_*(*)()> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QObject_*(*)()> *this_01;
  QArrayDataPointer<QObject_*(*)()> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QObject_*(*)()> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QObject_*(*)()> *__file;
  
  QArrayDataPointer<QObject_*(*)()>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QObject_*(*)()>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QObject_*(*)()> *)capacity((QList<QObject_*(*)()> *)0x450631);
    qVar2 = QArrayDataPointer<QObject_*(*)()>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QObject_*(*)()> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QObject_*(*)()> *)
                QArrayDataPointer<QObject_*(*)()>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QObject_*(*)()>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QObject_*(*)()>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (_func_QObject_ptr ***)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}